

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O0

AVLTreeNode<short> * __thiscall itis::AVLTreeNode<short>::left_rotate(AVLTreeNode<short> *this)

{
  AVLTreeNode<short> *this_00;
  AVLTreeNode<short> *R;
  AVLTreeNode<short> *this_local;
  
  this_00 = this->right;
  this->right = this->right->left;
  this_00->left = this;
  updateValues(this);
  updateValues(this_00);
  return this_00;
}

Assistant:

AVLTreeNode<T>* AVLTreeNode<T>::left_rotate() {
    AVLTreeNode* R = right;
    right = right->left;
    R->left = this;

    this->updateValues();  // the order is important
    R->updateValues();

    return R;
  }